

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

void rsg::computeRandomValueRange(GeneratorState *state,ValueRangeAccess valueRange)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  Type TVar5;
  int iVar6;
  bool *pbVar7;
  int *piVar8;
  float *pfVar9;
  Exception *this;
  float fVar10;
  bool local_175;
  allocator<char> local_149;
  string local_148;
  ConstStridedValueAccess<1> local_128;
  ConstStridedValueAccess<1> local_118;
  ConstStridedValueAccess<1> local_108;
  ConstStridedValueAccess<1> local_f8;
  float local_e8;
  float local_e4;
  float maxVal_2;
  float minVal_2;
  int minStep;
  int rangeLen_1;
  float minFloatVal;
  int maxSteps;
  float step;
  int ndx_2;
  ConstStridedValueAccess<1> local_b8;
  ConstStridedValueAccess<1> local_a8;
  ConstStridedValueAccess<1> local_98;
  int local_84;
  int local_80;
  int maxVal_1;
  int minVal_1;
  int rangeLen;
  int maxRangeLen;
  int maxIntVal;
  int minIntVal;
  int ndx_1;
  ConstStridedValueAccess<1> local_58;
  ConstStridedValueAccess<1> local_48;
  ConstStridedValueAccess<1> local_38;
  bool local_26;
  byte local_25;
  int local_24;
  bool maxVal;
  bool minVal;
  Random *pRStack_20;
  int ndx;
  Random *rnd;
  VariableType *type;
  GeneratorState *state_local;
  
  type = (VariableType *)state;
  rnd = (Random *)ConstValueRangeAccess::getType(&valueRange.super_ConstValueRangeAccess);
  pRStack_20 = GeneratorState::getRandom((GeneratorState *)type);
  TVar5 = VariableType::getBaseType((VariableType *)rnd);
  if (TVar5 == TYPE_FLOAT) {
    for (maxSteps = 0; iVar2 = maxSteps, iVar6 = VariableType::getNumElements((VariableType *)rnd),
        iVar2 < iVar6; maxSteps = maxSteps + 1) {
      minFloatVal = 0.1;
      rangeLen_1 = 0x140;
      minStep = -0x3e800000;
      minVal_2 = (float)de::Random::getInt(pRStack_20,0,0x140);
      maxVal_2 = (float)de::Random::getInt(pRStack_20,0,0x140 - (int)minVal_2);
      fVar10 = (float)(int)maxVal_2 * 0.1 + -16.0;
      local_e8 = (float)(int)minVal_2 * 0.1 + fVar10;
      local_e4 = fVar10;
      local_108 = (ConstStridedValueAccess<1>)
                  ValueRangeAccess::getMin
                            ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_f8 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_108,maxSteps);
      pfVar9 = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_f8);
      fVar1 = local_e8;
      *pfVar9 = fVar10;
      local_128 = (ConstStridedValueAccess<1>)
                  ValueRangeAccess::getMax
                            ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_118 = (ConstStridedValueAccess<1>)
                  StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_128,maxSteps);
      pfVar9 = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_118);
      *pfVar9 = fVar1;
    }
  }
  else if (TVar5 == TYPE_INT) {
    for (maxIntVal = 0; iVar2 = maxIntVal, iVar6 = VariableType::getNumElements((VariableType *)rnd)
        , iVar2 < iVar6; maxIntVal = maxIntVal + 1) {
      maxRangeLen = -0x10;
      rangeLen = 0x10;
      minVal_1 = 0x20;
      maxVal_1 = de::Random::getInt(pRStack_20,0,0x20);
      iVar6 = de::Random::getInt(pRStack_20,0,0x20 - maxVal_1);
      iVar6 = iVar6 + -0x10;
      local_84 = iVar6 + maxVal_1;
      local_80 = iVar6;
      local_a8 = (ConstStridedValueAccess<1>)
                 ValueRangeAccess::getMin
                           ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_98 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_a8,maxIntVal);
      piVar8 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_98);
      iVar2 = local_84;
      *piVar8 = iVar6;
      _step = (ConstStridedValueAccess<1>)
              ValueRangeAccess::getMax((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_b8 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&step,maxIntVal);
      piVar8 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_b8);
      *piVar8 = iVar2;
    }
  }
  else {
    if (TVar5 != TYPE_BOOL) {
      this = (Exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"computeRandomValueRange(): Unsupported type",&local_149);
      Exception::Exception(this,&local_148);
      __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
    }
    for (local_24 = 0; iVar2 = local_24, iVar6 = VariableType::getNumElements((VariableType *)rnd),
        iVar2 < iVar6; local_24 = local_24 + 1) {
      local_25 = de::Random::getBool(pRStack_20);
      if ((bool)local_25) {
        local_175 = true;
      }
      else {
        local_175 = de::Random::getBool(pRStack_20);
      }
      bVar4 = local_25;
      local_26 = local_175;
      local_48 = (ConstStridedValueAccess<1>)
                 ValueRangeAccess::getMin
                           ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_38 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,local_24);
      pbVar7 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_38);
      bVar3 = local_26;
      *pbVar7 = (bool)(bVar4 & 1);
      _minIntVal = (ConstStridedValueAccess<1>)
                   ValueRangeAccess::getMax
                             ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_58 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&minIntVal,local_24);
      pbVar7 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_58);
      *pbVar7 = (bool)(bVar3 & 1);
    }
  }
  return;
}

Assistant:

void computeRandomValueRange (GeneratorState& state, ValueRangeAccess valueRange)
{
	const VariableType&	type	= valueRange.getType();
	de::Random&			rnd		= state.getRandom();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				bool minVal = rnd.getBool();
				bool maxVal = minVal ? true : rnd.getBool();
				valueRange.getMin().component(ndx).asBool() = minVal;
				valueRange.getMax().component(ndx).asBool() = maxVal;
			}
			break;

		case VariableType::TYPE_INT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const int minIntVal		= -16;
				const int maxIntVal		=  16;
				const int maxRangeLen	= maxIntVal - minIntVal;

				int rangeLen	= rnd.getInt(0, maxRangeLen);
				int minVal		= minIntVal + rnd.getInt(0, maxRangeLen-rangeLen);
				int maxVal		= minVal + rangeLen;

				valueRange.getMin().component(ndx).asInt() = minVal;
				valueRange.getMax().component(ndx).asInt() = maxVal;
			}
			break;

		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const float step			= 0.1f;
				const int	maxSteps		= 320;
				const float minFloatVal		= -16.0f;

				int rangeLen	= rnd.getInt(0, maxSteps);
				int minStep		= rnd.getInt(0, maxSteps-rangeLen);

				float minVal	= minFloatVal + step*(float)minStep;
				float maxVal	= minVal + step*(float)rangeLen;

				valueRange.getMin().component(ndx).asFloat() = minVal;
				valueRange.getMax().component(ndx).asFloat() = maxVal;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("computeRandomValueRange(): Unsupported type");
	}
}